

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

void __thiscall Js::FunctionBody::SetHasHotLoop(FunctionBody *this)

{
  uint16 uVar1;
  FunctionBody *this_local;
  
  if (((*(uint *)&this->field_0x178 >> 0xe & 1) == 0) &&
     (*(uint *)&this->field_0x178 = *(uint *)&this->field_0x178 & 0xffffbfff | 0x4000,
     (DAT_01eafd98 & 1) == 0)) {
    FunctionExecutionStateMachine::CommitExecutedIterations(&this->executionState);
    TraceExecutionMode(this,"HasHotLoop (before)");
    uVar1 = FunctionExecutionStateMachine::GetFullJitThreshold(&this->executionState);
    if (1 < uVar1) {
      FunctionExecutionStateMachine::SetFullJitThreshold(&this->executionState,1,true);
    }
    TraceExecutionMode(this,"HasHotLoop");
  }
  return;
}

Assistant:

void FunctionBody::SetHasHotLoop()
    {
        if(hasHotLoop)
        {
            return;
        }
        hasHotLoop = true;

        if(Configuration::Global.flags.EnforceExecutionModeLimits)
        {
            return;
        }

        executionState.CommitExecutedIterations();
        TraceExecutionMode("HasHotLoop (before)");
        if(executionState.GetFullJitThreshold() > 1)
        {
            executionState.SetFullJitThreshold(1, true);
        }
        TraceExecutionMode("HasHotLoop");
    }